

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::crossMesh(Mesh *__return_storage_ptr__,vec3 *_pos,float _width)

{
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_48;
  undefined8 local_44;
  float local_3c;
  undefined8 local_38;
  float local_30;
  float local_2c;
  undefined4 local_28;
  float local_24;
  float local_20;
  undefined4 local_1c;
  
  local_30 = (_pos->field_0).x;
  local_44._0_4_ = _pos->field_1;
  local_44._4_4_ = _pos->field_2;
  local_48.x = local_30 - _width;
  local_3c = local_30 + _width;
  local_2c = (float)(undefined4)local_44 - _width;
  local_20 = _width + (float)(undefined4)local_44;
  local_38 = local_44;
  local_28 = local_44._4_4_;
  local_24 = local_30;
  local_1c = local_44._4_4_;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)&local_48,4);
  return __return_storage_ptr__;
}

Assistant:

Mesh crossMesh(const glm::vec3 &_pos, float _width) {
    glm::vec3 linePoints[4] = { glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z),
                                glm::vec3(_pos.x,_pos.y,_pos.z) };

    linePoints[0].x -= _width;
    linePoints[1].x += _width;
    linePoints[2].y -= _width;
    linePoints[3].y += _width;

    Mesh mesh;
    mesh.setDrawMode(LINES);
    mesh.addVertices(linePoints, 4);

    // mesh.append( line(linePoints[0] , linePoints[1]) );
    // mesh.append( line(linePoints[2] , linePoints[3]) );

    return mesh;
}